

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_OnChangedTextureID(ImDrawList *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ImTextureID pvVar4;
  ImDrawCmd *pIVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImDrawCmd *pIVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pIVar5 = (this->CmdBuffer).Data;
  iVar12 = (this->CmdBuffer).Size;
  if ((pIVar5[(long)iVar12 + -1].ElemCount != 0) &&
     (pIVar5[(long)iVar12 + -1].TextureId != (this->_CmdHeader).TextureId)) {
    fVar6 = (this->_CmdHeader).ClipRect.x;
    fVar7 = (this->_CmdHeader).ClipRect.y;
    fVar8 = (this->_CmdHeader).ClipRect.z;
    fVar9 = (this->_CmdHeader).ClipRect.w;
    pvVar4 = (this->_CmdHeader).TextureId;
    uVar1 = (this->_CmdHeader).VtxOffset;
    uVar2 = (this->IdxBuffer).Size;
    iVar12 = (this->CmdBuffer).Size;
    iVar3 = (this->CmdBuffer).Capacity;
    if (iVar12 == iVar3) {
      iVar12 = iVar12 + 1;
      if (iVar3 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar3 / 2 + iVar3;
      }
      if (iVar12 < iVar11) {
        iVar12 = iVar11;
      }
      if (iVar3 < iVar12) {
        pIVar10 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar12 * 0x38);
        pIVar5 = (this->CmdBuffer).Data;
        if (pIVar5 != (ImDrawCmd *)0x0) {
          memcpy(pIVar10,pIVar5,(long)(this->CmdBuffer).Size * 0x38);
          ImGui::MemFree((this->CmdBuffer).Data);
        }
        (this->CmdBuffer).Data = pIVar10;
        (this->CmdBuffer).Capacity = iVar12;
      }
    }
    pIVar10 = (this->CmdBuffer).Data;
    iVar12 = (this->CmdBuffer).Size;
    pIVar5 = pIVar10 + iVar12;
    (pIVar5->ClipRect).x = fVar6;
    (pIVar5->ClipRect).y = fVar7;
    (pIVar5->ClipRect).z = fVar8;
    (pIVar5->ClipRect).w = fVar9;
    pIVar10[iVar12].TextureId = pvVar4;
    pIVar10[iVar12].VtxOffset = uVar1;
    pIVar10[iVar12].IdxOffset = uVar2;
    *(undefined8 *)&pIVar10[iVar12].ElemCount = 0;
    *(ImDrawCallback *)(&pIVar10[iVar12].ElemCount + 2) = (ImDrawCallback)0x0;
    pIVar10[iVar12].UserCallbackData = (void *)0x0;
    (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    return;
  }
  if ((((1 < iVar12) && (pIVar5[(long)iVar12 + -1].ElemCount == 0)) &&
      (auVar14[0] = -(*(char *)&pIVar5[(long)iVar12 + -2].ClipRect.x ==
                     *(char *)&(this->_CmdHeader).ClipRect.x),
      auVar14[1] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.x + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 1)),
      auVar14[2] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.x + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 2)),
      auVar14[3] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.x + 3) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.x + 3)),
      auVar14[4] = -(*(char *)&pIVar5[(long)iVar12 + -2].ClipRect.y ==
                    *(char *)&(this->_CmdHeader).ClipRect.y),
      auVar14[5] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.y + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 1)),
      auVar14[6] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.y + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 2)),
      auVar14[7] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.y + 3) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.y + 3)),
      auVar14[8] = -(*(char *)&pIVar5[(long)iVar12 + -2].ClipRect.z ==
                    *(char *)&(this->_CmdHeader).ClipRect.z),
      auVar14[9] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.z + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.z + 1)),
      auVar14[10] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.z + 2) ==
                     *(char *)((long)&(this->_CmdHeader).ClipRect.z + 2)),
      auVar14[0xb] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.z + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.z + 3)),
      auVar14[0xc] = -(*(char *)&pIVar5[(long)iVar12 + -2].ClipRect.w ==
                      *(char *)&(this->_CmdHeader).ClipRect.w),
      auVar14[0xd] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.w + 1) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
      auVar14[0xe] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.w + 2) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
      auVar14[0xf] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.w + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
      auVar13[0] = -(*(char *)&pIVar5[(long)iVar12 + -2].ClipRect.w ==
                    *(char *)&(this->_CmdHeader).ClipRect.w),
      auVar13[1] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.w + 1) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
      auVar13[2] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.w + 2) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
      auVar13[3] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].ClipRect.w + 3) ==
                    *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
      auVar13[4] = -(*(char *)&pIVar5[(long)iVar12 + -2].TextureId ==
                    *(char *)&(this->_CmdHeader).TextureId),
      auVar13[5] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].TextureId + 1) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 1)),
      auVar13[6] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].TextureId + 2) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 2)),
      auVar13[7] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].TextureId + 3) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 3)),
      auVar13[8] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].TextureId + 4) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 4)),
      auVar13[9] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].TextureId + 5) ==
                    *(char *)((long)&(this->_CmdHeader).TextureId + 5)),
      auVar13[10] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].TextureId + 6) ==
                     *(char *)((long)&(this->_CmdHeader).TextureId + 6)),
      auVar13[0xb] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].TextureId + 7) ==
                      *(char *)((long)&(this->_CmdHeader).TextureId + 7)),
      auVar13[0xc] = -((char)pIVar5[(long)iVar12 + -2].VtxOffset ==
                      (char)(this->_CmdHeader).VtxOffset),
      auVar13[0xd] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].VtxOffset + 1) ==
                      *(char *)((long)&(this->_CmdHeader).VtxOffset + 1)),
      auVar13[0xe] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].VtxOffset + 2) ==
                      *(char *)((long)&(this->_CmdHeader).VtxOffset + 2)),
      auVar13[0xf] = -(*(char *)((long)&pIVar5[(long)iVar12 + -2].VtxOffset + 3) ==
                      *(char *)((long)&(this->_CmdHeader).VtxOffset + 3)),
      auVar13 = auVar13 & auVar14,
      (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff)) &&
     (pIVar5[(long)iVar12 + -2].UserCallback == (ImDrawCallback)0x0)) {
    (this->CmdBuffer).Size = iVar12 + -1;
    return;
  }
  pIVar5[(long)iVar12 + -1].TextureId = (this->_CmdHeader).TextureId;
  return;
}

Assistant:

void ImDrawList::_OnChangedTextureID()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != _CmdHeader.TextureId)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->TextureId = _CmdHeader.TextureId;
}